

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsView::render
          (QGraphicsView *this,QPainter *painter,QRectF *target,QRect *source,
          AspectRatioMode aspectRatioMode)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  QGraphicsViewPrivate *pQVar5;
  ulong uVar6;
  long *plVar7;
  double *pdVar8;
  QTransform *worldTransform;
  void *pvVar9;
  qsizetype qVar10;
  const_reference ppQVar11;
  qint64 qVar12;
  QTransform *pQVar13;
  QStyleOptionGraphicsItem *pQVar14;
  qreal *in_RCX;
  QRectF *in_RDX;
  QPainterPath *in_RSI;
  long *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QStyleOptionGraphicsItem *option;
  qreal qVar15;
  double dVar16;
  QStyleOptionGraphicsItem *array;
  QGraphicsViewPrivate *this_00;
  int i_1;
  QStyleOptionGraphicsItem *styleOptionArray;
  int i;
  int numItems;
  QGraphicsItem **itemArray;
  QGraphicsViewPrivate *d;
  QRectF sourceSceneRect;
  QPainterPath path;
  QList<QGraphicsItem_*> itemList;
  QPolygonF sourceScenePoly;
  qreal yratio;
  qreal xratio;
  QRectF targetRect;
  QRect sourceRect;
  QTransform painterMatrix;
  QTransform moveMatrix;
  QRect *in_stack_fffffffffffffce8;
  QGraphicsViewPrivate *in_stack_fffffffffffffcf0;
  QPainterPath *pQVar17;
  QRect *in_stack_fffffffffffffcf8;
  QRectF *in_stack_fffffffffffffd00;
  QWidget *in_stack_fffffffffffffd08;
  QGraphicsView *in_stack_fffffffffffffd10;
  QGraphicsScene *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  QRect *in_stack_fffffffffffffd28;
  QGraphicsItemPrivate *this_01;
  int local_28c;
  int local_280;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  QPainterPath local_220 [8];
  undefined1 *local_218;
  QRect local_210;
  QRegion local_200;
  QList<QGraphicsItem_*> local_1f8;
  QRect local_1e0;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  double local_1b8;
  double local_1b0;
  _func_int **local_1a8;
  Data *local_1a0;
  ExtraStruct *local_198;
  qreal local_190;
  undefined1 local_188 [40];
  qreal local_160;
  qreal local_158;
  qreal local_150;
  QTransform local_f8;
  undefined1 local_a8 [160];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsView *)0xa3a109);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3a125);
  if (((bVar2) && (in_RSI != (QPainterPath *)0x0)) &&
     (uVar6 = QPainter::isActive(), (uVar6 & 1) != 0)) {
    local_158 = *in_RCX;
    local_150 = in_RCX[1];
    bVar2 = QRect::isNull((QRect *)in_stack_fffffffffffffcf0);
    if (bVar2) {
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffcf0);
      join_0x00000010_0x00000000_ = QWidget::rect(in_stack_fffffffffffffd08);
      local_158 = (qreal)local_188._32_8_;
      local_150 = local_160;
    }
    local_188._0_8_ = in_RDX->xp;
    local_188._8_8_ = in_RDX->yp;
    local_188._16_8_ = in_RDX->w;
    local_188._24_8_ = in_RDX->h;
    bVar2 = QRectF::isNull(in_RDX);
    if (bVar2) {
      plVar7 = (long *)QPainter::device();
      iVar3 = (**(code **)(*plVar7 + 0x10))();
      if (iVar3 == 5) {
        QRectF::QRectF(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        local_188._0_8_ = local_1a8;
        local_188._8_8_ = local_1a0;
        local_188._16_8_ = local_198;
        local_188._24_8_ = local_190;
      }
      else {
        QPainter::device();
        iVar3 = QPaintDevice::width((QPaintDevice *)0xa3a2f1);
        QPainter::device();
        iVar4 = QPaintDevice::height((QPaintDevice *)0xa3a310);
        QRectF::setRect((QRectF *)local_188,0.0,0.0,(double)iVar3,(double)iVar4);
      }
    }
    this_01 = (QGraphicsItemPrivate *)local_188;
    option = (QStyleOptionGraphicsItem *)QRectF::width((QRectF *)this_01);
    iVar3 = QRect::width(in_stack_fffffffffffffce8);
    local_1b0 = (double)option / (double)iVar3;
    qVar15 = QRectF::height((QRectF *)this_01);
    iVar3 = QRect::height(in_stack_fffffffffffffce8);
    local_1b8 = qVar15 / (double)iVar3;
    if (in_R8D != 0) {
      if (in_R8D == 1) {
        pdVar8 = qMin<double>(&local_1b0,&local_1b8);
        local_1b8 = *pdVar8;
        local_1b0 = local_1b8;
      }
      else if (in_R8D == 2) {
        pdVar8 = qMax<double>(&local_1b0,&local_1b8);
        local_1b8 = *pdVar8;
        local_1b0 = local_1b8;
      }
    }
    local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1e0 = QRect::adjusted(in_stack_fffffffffffffd28,
                                (int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                                (int)in_stack_fffffffffffffd20,
                                (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                                (int)in_stack_fffffffffffffd18);
    mapToScene(in_stack_fffffffffffffd10,(QRect *)in_stack_fffffffffffffd08);
    local_1f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_1f8.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_1f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    worldTransform =
         (QTransform *)QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3a4dc);
    QTransform::QTransform((QTransform *)in_stack_fffffffffffffcf0);
    QGraphicsScene::items
              (in_stack_fffffffffffffd18,(QPolygonF *)in_stack_fffffffffffffd10,
               (ItemSelectionMode)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               (SortOrder)in_stack_fffffffffffffd08,(QTransform *)in_stack_fffffffffffffd00);
    uVar6 = QList<QGraphicsItem_*>::size(&local_1f8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar6 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar6);
    qVar10 = QList<QGraphicsItem_*>::size(&local_1f8);
    iVar3 = (int)qVar10;
    for (local_280 = 0; local_280 < iVar3; local_280 = local_280 + 1) {
      ppQVar11 = QList<QGraphicsItem_*>::at
                           ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffcf0,
                            (qsizetype)in_stack_fffffffffffffce8);
      *(QGraphicsItem **)((long)pvVar9 + (long)((iVar3 - local_280) + -1) * 8) = *ppQVar11;
    }
    QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)in_stack_fffffffffffffcf0);
    memcpy(local_a8,&DAT_00b47ec8,0x50);
    qVar12 = QGraphicsViewPrivate::horizontalScroll(in_stack_fffffffffffffcf0);
    dVar16 = (double)-qVar12;
    qVar12 = QGraphicsViewPrivate::verticalScroll(in_stack_fffffffffffffcf0);
    QTransform::fromTranslate(dVar16,(double)-qVar12);
    memcpy(&local_f8,&DAT_00b47f18,0x50);
    QTransform::operator*(&local_f8,(QTransform *)&pQVar5->matrix);
    QTransform::QTransform((QTransform *)in_stack_fffffffffffffcf0);
    array = (QStyleOptionGraphicsItem *)QRectF::left((QRectF *)local_188);
    qVar15 = QRectF::top((QRectF *)local_188);
    QTransform::translate((double)array,qVar15);
    pQVar5 = (QGraphicsViewPrivate *)QTransform::scale(local_1b0,local_1b8);
    iVar4 = QRect::left((QRect *)0xa3a6ea);
    this_00 = (QGraphicsViewPrivate *)(double)-iVar4;
    iVar4 = QRect::top((QRect *)0xa3a707);
    pQVar13 = (QTransform *)QTransform::translate((double)this_00,(double)-iVar4);
    QTransform::operator*=(&local_f8,pQVar13);
    pQVar14 = QGraphicsViewPrivate::allocStyleOptionsArray(this_00,(int)((ulong)pQVar5 >> 0x20));
    for (local_28c = 0; local_28c < iVar3; local_28c = local_28c + 1) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(*(long *)((long)pvVar9 + (long)local_28c * 8) + 8));
      local_210 = QRectF::toRect((QRectF *)array);
      QRegion::QRegion(&local_200,(QRect *)&local_210,Rectangle);
      QGraphicsItemPrivate::initStyleOption
                (this_01,option,worldTransform,(QRegion *)this_00,SUB81((ulong)pQVar5 >> 0x38,0));
      QRegion::~QRegion(&local_200);
    }
    QPainter::save();
    QPainter::setClipRect((QRectF *)in_RSI,(ClipOperation)local_188);
    local_218 = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)&local_218);
    QPainterPath::addPolygon((QPolygonF *)&local_218);
    QPainterPath::closeSubpath();
    pQVar17 = in_RSI;
    QTransform::map(local_220);
    QPainter::setClipPath(pQVar17,(ClipOperation)local_220);
    QPainterPath::~QPainterPath(local_220);
    QPainter::setTransform((QTransform *)in_RSI,SUB81(&local_f8,0));
    local_240 = 0xffffffffffffffff;
    local_238 = 0xffffffffffffffff;
    local_230 = 0xffffffffffffffff;
    local_228 = 0xffffffffffffffff;
    QPolygonF::boundingRect();
    (**(code **)(*in_RDI + 0x1c8))(in_RDI,in_RSI,&local_240);
    (**(code **)(*in_RDI + 0x1d8))(in_RDI,in_RSI,iVar3,pvVar9,pQVar14);
    (**(code **)(*in_RDI + 0x1d0))(in_RDI,in_RSI,&local_240);
    if (pvVar9 != (void *)0x0) {
      operator_delete__(pvVar9);
    }
    QGraphicsViewPrivate::freeStyleOptionsArray(pQVar5,array);
    QPainter::restore();
    QPainterPath::~QPainterPath((QPainterPath *)&local_218);
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa3aa0c);
    QPolygonF::~QPolygonF((QPolygonF *)0xa3aa19);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::render(QPainter *painter, const QRectF &target, const QRect &source,
                           Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    Q_D(QGraphicsView);
    if (!d->scene || !(painter && painter->isActive()))
        return;

    // Default source rect = viewport rect
    QRect sourceRect = source;
    if (source.isNull())
        sourceRect = viewport()->rect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (target.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QPolygonF sourceScenePoly = mapToScene(sourceRect.adjusted(-1, -1, 1, 1));
    QList<QGraphicsItem *> itemList = d->scene->items(sourceScenePoly,
                                                      Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    int numItems = itemList.size();
    for (int i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    // Setup painter matrix.
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    QTransform painterMatrix = d->matrix * moveMatrix;
    painterMatrix *= QTransform()
                     .translate(targetRect.left(), targetRect.top())
                     .scale(xratio, yratio)
                     .translate(-sourceRect.left(), -sourceRect.top());

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = d->allocStyleOptionsArray(numItems);
    for (int i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterMatrix, targetRect.toRect());

    painter->save();

    // Clip in device coordinates to avoid QRegion transformations.
    painter->setClipRect(targetRect);
    QPainterPath path;
    path.addPolygon(sourceScenePoly);
    path.closeSubpath();
    painter->setClipPath(painterMatrix.map(path), Qt::IntersectClip);

    // Transform the painter.
    painter->setTransform(painterMatrix, true);

    // Render the scene.
    QRectF sourceSceneRect = sourceScenePoly.boundingRect();
    drawBackground(painter, sourceSceneRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceSceneRect);

    delete [] itemArray;
    d->freeStyleOptionsArray(styleOptionArray);

    painter->restore();
}